

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

bfile_t * bf_create_m(uint8_t *buffer,uint len)

{
  byte *pbVar1;
  bfile_t *pbVar2;
  
  pbVar2 = create_bfile_t(0);
  pbVar2->buffer = buffer;
  pbVar2->size = (ulong)len;
  pbVar2->buffer_size = len;
  pbVar1 = (byte *)((long)&pbVar2->flags + 1);
  *pbVar1 = *pbVar1 | 5;
  pbVar2->ipos = (ulong)len;
  return pbVar2;
}

Assistant:

bfile_t  *
bf_create_m(
    const uint8_t * buffer,
    unsigned int len )
{
    bfile_t * bfile;
    bfile = create_bfile_t( 0 );
    bfile->buffer = (uint8_t*) buffer;
    bfile->size = len;
    bfile->buffer_size = len;
    bfile->flags |= BF_MEMBUFFER | BF_READABLE;
    bfile->ipos = len;
    return bfile;
}